

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageAndMetadata *
pbrt::Image::Read(ImageAndMetadata *__return_storage_ptr__,string *name,Allocator alloc,
                 ColorEncodingHandle *encoding)

{
  _Rb_tree_header *p_Var1;
  optional<float> oVar2;
  undefined4 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  LodePNGColorType LVar6;
  undefined1 auVar7 [32];
  undefined8 uVar8;
  ImageAndMetadata *pIVar9;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> aVar10;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> aVar11;
  bool bVar12;
  bool bVar13;
  ushort uVar14;
  ushort uVar15;
  uint i;
  int iVar16;
  LodePNGColorType LVar17;
  uint uVar18;
  Box2i *pBVar19;
  Header *pHVar20;
  TypedAttribute<float> *pTVar21;
  TypedAttribute<Imath_2_5::Matrix44<float>_> *pTVar22;
  int *piVar23;
  TypedAttribute<int> *pTVar24;
  _Rb_tree_node_base *p_Var25;
  _Rb_tree_node_base *p_Var26;
  char *pcVar27;
  size_t sVar28;
  mapped_type *this;
  Allocator AVar29;
  TypedAttribute<Imf_2_5::Chromaticities> *pTVar30;
  FILE *__stream;
  float *pfVar31;
  void *pvVar32;
  stbi_uc *first;
  pbrt *ppVar33;
  uint uVar34;
  int bufferLength;
  int bufferLength_00;
  Point2i resolution;
  Point2i PVar35;
  int bufferLength_01;
  int bufferLength_02;
  Point2i resolution_00;
  Point2i resolution_01;
  Point2i resolution_02;
  Point2i resolution_03;
  Point2i resolution_04;
  Point2i resolution_05;
  Vec2<int> VVar36;
  Point2i resolution_06;
  long *plVar37;
  long lVar38;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar39;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_00;
  _Rb_tree_color _Var40;
  uint uVar41;
  _Rb_tree_node_base *unaff_R12;
  ulong uVar42;
  long *plVar43;
  ulong uVar44;
  GammaColorEncoding *pGVar45;
  Point2i resolution_07;
  Point2i resolution_08;
  Point2i resolution_09;
  Point2i resolution_10;
  Point2i resolution_11;
  Vec2<int> VVar46;
  Point2i resolution_12;
  Point2i resolution_13;
  Point2i resolution_14;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  Float FVar49;
  undefined1 auVar50 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_07;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_08;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_09;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_11;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_14;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_15;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  int height;
  int width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf_1;
  float scale;
  InputFile file;
  Float rgba [4];
  Image image;
  ImageMetadata metadata;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  LodePNGState state;
  uint local_5c8;
  uint local_5c4;
  Vec2<int> local_5c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5b8;
  Vec2<int> local_598;
  ImageAndMetadata *local_590;
  undefined1 local_588 [32];
  Vec2<int> local_568;
  Vec2<int> VStack_560;
  ulong local_550;
  aligned_storage_t<sizeof(float),_alignof(float)> local_548;
  float fStack_544;
  undefined1 local_540 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_538;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_518;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_510;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_4f0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_4d0;
  undefined1 local_4a8 [12];
  float fStack_49c;
  undefined1 auStack_498 [8];
  float fStack_490;
  float fStack_48c;
  _Base_ptr p_Stack_488;
  size_t sStack_480;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_478;
  undefined1 local_470 [24];
  size_t local_458;
  undefined1 local_450 [24];
  size_t local_438;
  undefined1 local_430 [24];
  size_t local_418;
  undefined1 local_408 [16];
  undefined1 auStack_3f8 [16];
  long alStack_3e8 [3];
  undefined1 auStack_3d0 [8];
  long lStack_3c8;
  bool bStack_3c0;
  undefined7 uStack_3bf;
  long lStack_3b8;
  undefined1 local_3b0 [8];
  long *local_3a8 [2];
  long lStack_398;
  undefined1 local_390 [8];
  undefined1 local_388 [16];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_378;
  bool local_368;
  bool local_35c;
  bool local_354;
  bool local_34c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_348;
  bool local_340;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_338;
  ulong local_308;
  long local_300;
  Box2i local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined2 local_2c8 [8];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  undefined1 local_278 [8];
  undefined1 local_270 [8];
  undefined1 auStack_268 [24];
  undefined8 uStack_250;
  undefined2 auStack_248 [4];
  undefined1 auStack_240 [8];
  long *plStack_238;
  uint local_230;
  undefined1 auStack_22c [44];
  undefined1 auStack_200 [20];
  bool local_1ec;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_1e8;
  bool local_1d8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_1d4;
  bool local_1cc;
  aligned_storage_t<sizeof(int),_alignof(int)> local_1c8;
  bool local_1c4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_1c0;
  bool local_1bc;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_1b8;
  LodePNGColorType local_1b0;
  uint local_1ac;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1a8 [4];
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_b0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_70;
  Vec2<int> local_50;
  Vec2<int> local_48;
  Vec2<int> local_40;
  Vec2<int> local_38;
  
  oVar2 = (optional<float>)((long)local_270 + 8);
  local_278 = (undefined1  [8])oVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"exr","");
  local_5c0 = (Vec2<int>)name;
  bVar12 = HasExtension(name,(string *)local_278);
  if ((optional<float>)local_278 != oVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (bVar12) {
    pcVar27 = *(char **)local_5c0;
    iVar16 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile((InputFile *)local_588,pcVar27,iVar16);
    Imf_2_5::InputFile::header();
    pBVar19 = (Box2i *)Imf_2_5::Header::dataWindow();
    local_568 = pBVar19->min;
    VStack_560 = pBVar19->max;
    local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = *pBVar19;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
    local_278[4] = 0;
    local_230 = local_230 & 0xffffff00;
    local_1ec = false;
    local_1d8 = false;
    local_1cc = false;
    local_1c4 = false;
    local_1bc = false;
    local_1b0 = local_1b0 & 0xffffff00;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar21 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>
                        (pHVar20,"renderTimeSeconds");
    if (pTVar21 != (TypedAttribute<float> *)0x0) {
      if ((bool)local_278[4] == true) {
        local_278 = (undefined1  [8])((ulong)local_278 & 0xffffff0000000000);
      }
      local_278[4] = true;
      local_278._0_4_ = pTVar21->_value;
    }
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar22 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar20,"worldToCamera");
    if (pTVar22 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      if (local_230._0_1_ == true) {
        local_230 = local_230 & 0xffffff00;
      }
      auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pTVar22->_value).x);
      _local_270 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                   )vmovdqu64_avx512f(auVar48);
      local_230 = CONCAT31(local_230._1_3_,1);
    }
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar22 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar20,"worldToNDC");
    if (pTVar22 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pTVar22->_value).x);
      auVar48 = vmovdqu64_avx512f(auVar48);
      auStack_22c._0_4_ = auVar48._0_4_;
      auStack_22c._4_2_ = auVar48._4_2_;
      stack0xfffffffffffffdda = auVar48._6_58_;
      local_1ec = true;
    }
    LVar17 = VStack_560.x + 1;
    uVar34 = VStack_560.y + 1;
    LVar6 = local_568.x;
    if ((int)LVar17 < local_568.x) {
      LVar6 = LVar17;
    }
    uVar41 = local_568.y;
    if ((int)uVar34 < local_568.y) {
      uVar41 = uVar34;
    }
    local_1e8._4_4_ = uVar41;
    local_1e8._0_4_ = LVar6;
    if ((int)LVar17 < local_568.x) {
      LVar17 = local_568.x;
    }
    if ((int)uVar34 < local_568.y) {
      uVar34 = local_568.y;
    }
    local_1e8._8_8_ = CONCAT44(uVar34,LVar17);
    local_1d8 = true;
    Imf_2_5::InputFile::header();
    piVar23 = (int *)Imf_2_5::Header::displayWindow();
    local_1d4._4_4_ = (piVar23[3] - piVar23[1]) + 1;
    local_1d4.__align = (anon_struct_4_0_00000001_for___align)((piVar23[2] - *piVar23) + 1);
    local_1cc = true;
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar24 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>
                        (pHVar20,"samplesPerPixel");
    if (pTVar24 != (TypedAttribute<int> *)0x0) {
      local_1c8 = (aligned_storage_t<sizeof(int),_alignof(int)>)pTVar24->_value;
      local_1c4 = true;
    }
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar21 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>(pHVar20,"MSE");
    if (pTVar21 != (TypedAttribute<float> *)0x0) {
      local_1c0 = (aligned_storage_t<sizeof(float),_alignof(float)>)pTVar21->_value;
      local_1bc = true;
    }
    local_590 = __return_storage_ptr__;
    local_568 = (Vec2<int>)alloc.memoryResource;
    Imf_2_5::InputFile::header();
    p_Var25 = (_Rb_tree_node_base *)Imf_2_5::Header::begin();
    while( true ) {
      Imf_2_5::InputFile::header();
      p_Var26 = (_Rb_tree_node_base *)Imf_2_5::Header::end();
      if (p_Var25 == p_Var26) break;
      pcVar27 = (char *)(**(code **)(**(long **)(p_Var25 + 9) + 0x10))();
      iVar16 = strcmp(pcVar27,"stringvector");
      if (iVar16 == 0) {
        lVar38 = *(long *)(p_Var25 + 9);
        unaff_R12 = p_Var25 + 1;
        local_408._0_8_ = auStack_3f8;
        sVar28 = strlen((char *)unaff_R12);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,unaff_R12,(long)&p_Var25[1]._M_color + sVar28);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)local_1a8,(key_type *)local_408);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar38 + 8));
        if ((undefined1 *)local_408._0_8_ != auStack_3f8) {
          operator_delete((void *)local_408._0_8_,(ulong)(auStack_3f8._0_8_ + 1));
        }
      }
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
    }
    pHVar20 = (Header *)Imf_2_5::InputFile::header();
    pTVar30 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>>
                        (pHVar20,"chromaticities");
    if (pTVar30 != (TypedAttribute<Imf_2_5::Chromaticities> *)0x0) {
      local_4a8._0_8_ = (pTVar30->_value).red;
      unique0x10002319 = (pTVar30->_value).green;
      auStack_498 = *(undefined1 (*) [8])&(pTVar30->_value).blue;
      _fStack_490 = (pTVar30->_value).white;
      local_1b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )RGBColorSpace::Lookup
                              ((Point2f)(pTVar30->_value).red,(Point2f)(pTVar30->_value).green,
                               (Point2f)(pTVar30->_value).blue,(Point2f)(pTVar30->_value).white);
      if (local_1b8 ==
          (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
           )0x0) {
        local_408._0_8_ = auStack_3f8;
        local_408._8_8_ = (float *)0x0;
        auStack_3f8._0_8_ = auStack_3f8._0_8_ & 0xffffffffffffff00;
        detail::stringPrintfRecursive<float&,float&,float&,float&,float&,float&,float&,float&>
                  ((string *)local_408,
                   "Couldn\'t find supported color space that matches chromaticities: r (%f, %f) g (%f, %f) b (%f, %f), w (%f, %f). Using sRGB."
                   ,(float *)local_4a8,(float *)(local_4a8 + 4),(float *)(local_4a8 + 8),&fStack_49c
                   ,(float *)auStack_498,(float *)(auStack_498 + 4),&fStack_490,&fStack_48c);
        Warning((FileLoc *)0x0,(char *)local_408._0_8_);
        if ((undefined1 *)local_408._0_8_ != auStack_3f8) {
          operator_delete((void *)local_408._0_8_,(ulong)(auStack_3f8._0_8_ + 1));
        }
        local_1b8 = RGBColorSpace::sRGB;
        if ((bool)(undefined1)local_1b0 == true) {
          local_1b0 = local_1b0 & 0xffffff00;
        }
      }
      else if ((bool)(undefined1)local_1b0 == true) {
        local_1b0 = local_1b0 & 0xffffff00;
      }
      local_1b0 = CONCAT31(local_1b0._1_3_,1);
    }
    local_5c4 = ((int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) + 1;
    local_5c8 = (local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish._4_4_ -
                local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_) + 1;
    local_2f8.min.x = 0;
    local_2f8.min.y = 0;
    local_2f8.max.x = 0;
    local_2f8.max.y = 0;
    local_2e8._M_allocated_capacity = 0;
    Imf_2_5::InputFile::header();
    Imf_2_5::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::begin();
    iVar16 = 0;
    do {
      p_Var26 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::end();
      _Var40 = (_Rb_tree_color)unaff_R12;
      if (p_Var25 == p_Var26) {
        if (_Var40 - _S_black < 2) {
          channels_01.n = (long)local_2f8.max - (long)local_2f8.min >> 5;
          local_598.x = 0;
          local_598.y = 0;
          PVar35.super_Tuple2<pbrt::Point2,_int>.y = local_5c8;
          PVar35.super_Tuple2<pbrt::Point2,_int>.x = local_5c4;
          channels_01.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8.min;
          Image((Image *)local_408,(_Var40 != _S_black) + Half,PVar35,channels_01,
                (ColorEncodingHandle *)&local_598,(Allocator)local_568);
          pIVar9 = local_590;
          AllChannelsDesc((ImageChannelDesc *)&local_548.__align,(Image *)local_408);
          imageToFrameBuffer((FrameBuffer *)local_4a8,(Image *)local_408,
                             (ImageChannelDesc *)&local_548.__align,(Box2i *)&local_5b8);
          Imf_2_5::InputFile::setFrameBuffer((FrameBuffer *)local_588);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)local_4a8);
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
                     &local_548.__align);
          Imf_2_5::InputFile::readPixels
                    ((int)local_588,
                     local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_);
          if (LOGGING_LogLevel < 1) {
            local_4a8._8_4_ = 0.0;
            fStack_49c = 0.0;
            auStack_498 = (undefined1  [8])((ulong)auStack_498 & 0xffffffffffffff00);
            local_4a8._0_8_ = auStack_498;
            detail::stringPrintfRecursive<std::__cxx11::string_const&,int&,int&>
                      ((string *)local_4a8,"Read EXR image %s (%d x %d)",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5c0,(int *)&local_5c4,(int *)&local_5c8);
            Log(Verbose,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                ,0x438,(char *)local_4a8._0_8_);
            if ((undefined1 *)local_4a8._0_8_ != auStack_498) {
              operator_delete((void *)local_4a8._0_8_,(long)auStack_498 + 1);
            }
          }
          (pIVar9->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = local_408._8_4_;
          (pIVar9->image).format = local_408._0_4_;
          (pIVar9->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = local_408._4_4_;
          (pIVar9->image).channelNames.alloc.memoryResource = (memory_resource *)auStack_3f8._0_8_;
          (pIVar9->image).channelNames.nStored = 0;
          (pIVar9->image).channelNames.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          (pIVar9->image).channelNames.nAlloc = 0;
          (pIVar9->image).channelNames.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               auStack_3f8._8_8_;
          auVar4._8_8_ = alStack_3e8[1];
          auVar4._0_8_ = alStack_3e8[0];
          auVar4._16_2_ = (undefined2)alStack_3e8[2];
          auVar4._18_6_ = alStack_3e8[2]._2_6_;
          auVar4._24_8_ = auStack_3d0;
          alStack_3e8[1] = 0;
          auStack_3f8._8_8_ = 0;
          alStack_3e8[0] = 0;
          (pIVar9->image).encoding.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = 0;
          auVar7._2_6_ = alStack_3e8[2]._2_6_;
          auVar7._0_2_ = (undefined2)alStack_3e8[2];
          auVar7._8_8_ = auStack_3d0;
          auVar7._16_8_ = lStack_3c8;
          auVar7[0x18] = bStack_3c0;
          auVar7._25_7_ = uStack_3bf;
          auVar4 = vperm2i128_avx2(auVar4,auVar7,0x20);
          *(undefined1 (*) [32])&(pIVar9->image).channelNames.nAlloc = auVar4;
          (pIVar9->image).p8.ptr = (uchar *)0x0;
          (pIVar9->image).p8.nAlloc = 0;
          (pIVar9->image).p8.nStored = 0;
          (pIVar9->image).p8.nAlloc = CONCAT71(uStack_3bf,bStack_3c0);
          (pIVar9->image).p8.nStored = lStack_3b8;
          (pIVar9->image).p8.ptr = (uchar *)lStack_3c8;
          lStack_3b8 = 0;
          lStack_3c8 = 0;
          bStack_3c0 = false;
          uStack_3bf = 0;
          (pIVar9->image).p16.alloc.memoryResource = (memory_resource *)local_3b0;
          (pIVar9->image).p16.nStored = 0;
          (pIVar9->image).p16.ptr = (Half *)0x0;
          (pIVar9->image).p16.nAlloc = 0;
          (pIVar9->image).p16.nAlloc = (size_t)local_3a8[1];
          (pIVar9->image).p16.nStored = lStack_398;
          (pIVar9->image).p16.ptr = (Half *)local_3a8[0];
          lStack_398 = 0;
          local_3a8[0] = (long *)0x0;
          local_3a8[1] = (long *)0x0;
          (pIVar9->image).p32.alloc.memoryResource = (memory_resource *)local_390;
          (pIVar9->image).p32.nStored = 0;
          (pIVar9->image).p32.ptr = (float *)0x0;
          (pIVar9->image).p32.nAlloc = 0;
          (pIVar9->image).p32.nAlloc = local_388._8_8_;
          (pIVar9->image).p32.nStored = aStack_378._0_8_;
          (pIVar9->image).p32.ptr = (float *)local_388._0_8_;
          aStack_378._0_8_ = 0;
          local_388 = (undefined1  [16])0x0;
          ImageMetadata::ImageMetadata(&pIVar9->metadata,(ImageMetadata *)local_278);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_390);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_3b0)
          ;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     auStack_3d0);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_3f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2f8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(local_1a8);
          if ((bool)(undefined1)local_1b0 == true) {
            local_1b0 = local_1b0 & 0xffffff00;
          }
          if (local_1bc == true) {
            local_1bc = false;
          }
          if (local_1c4 == true) {
            local_1c4 = false;
          }
          if (local_1cc == true) {
            local_1cc = false;
          }
          if (local_1d8 == true) {
            local_1d8 = false;
          }
          if (local_1ec == true) {
            local_1ec = false;
          }
          if (local_230._0_1_ == true) {
            local_230 = local_230 & 0xffffff00;
          }
          if ((bool)local_278[4] == true) {
            local_278[4] = 0;
          }
          Imf_2_5::InputFile::~InputFile((InputFile *)local_588);
          return pIVar9;
        }
        LogFatal<char_const(&)[50]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                   ,0x432,"Check failed: %s",
                   (char (*) [50])"pixelType == Imf::HALF || pixelType == Imf::FLOAT");
      }
      bVar12 = iVar16 == 0;
      iVar16 = iVar16 + -1;
      if (bVar12) {
        unaff_R12 = (_Rb_tree_node_base *)(ulong)p_Var25[9]._M_color;
      }
      else if (_Var40 != p_Var25[9]._M_color) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x42d,"ReadEXR() doesn\'t currently support images with multiple channel types.");
      }
      local_408._0_8_ = auStack_3f8;
      sVar28 = strlen((char *)(p_Var25 + 1));
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,p_Var25 + 1,(long)&p_Var25[1]._M_color + sVar28);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
      if ((undefined1 *)local_408._0_8_ != auStack_3f8) {
        operator_delete((void *)local_408._0_8_,(ulong)(auStack_3f8._0_8_ + 1));
      }
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
    } while( true );
  }
  local_278 = (undefined1  [8])oVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"png","");
  bVar12 = HasExtension((string *)local_5c0,(string *)local_278);
  if ((optional<float>)local_278 != oVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (bVar12) {
    VVar36 = (Vec2<int>)
             (encoding->
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             ).bits;
    ReadFileContents((string *)local_588,(string *)local_5c0);
    local_568 = VVar36;
    if (VVar36 == (Vec2<int>)0x0) {
      local_568 = ColorEncodingHandle::sRGB;
    }
    local_278 = (undefined1  [8])&PTR__LodePNGState_02d13d70;
    lodepng_state_init((LodePNGState *)local_278);
    uVar34 = lodepng_inspect(&local_5c4,&local_5c8,(LodePNGState *)local_278,
                             (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_);
    if (uVar34 != 0) {
      local_408._0_8_ = lodepng_error_text(uVar34);
      ErrorExit<std::__cxx11::string_const&,char_const*>
                ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5c0,(char **)local_408);
    }
    local_4a8._0_8_ = (pointer)0x0;
    local_4a8._8_4_ = _S_red;
    auStack_498 = (undefined1  [8])pstd::pmr::new_delete_resource();
    _fStack_490 = (_Base_ptr)0x0;
    p_Stack_488 = (_Base_ptr)0x0;
    sStack_480 = 0;
    local_478.bits = 0;
    local_470._8_16_ = ZEXT416(0) << 0x40;
    local_458 = 0;
    local_438 = 0;
    local_418 = 0;
    local_470._0_8_ = alloc.memoryResource;
    local_450._0_8_ = alloc.memoryResource;
    local_450._8_16_ = local_470._8_16_;
    local_430._0_8_ = alloc.memoryResource;
    local_430._8_16_ = local_470._8_16_;
    if ((local_1b0 & ~LCT_GREY_ALPHA) == LCT_GREY) {
      local_2e8._M_allocated_capacity = 0;
      local_2f8 = (Box2i)local_470._8_16_;
      uVar18 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8,
                               &local_5c4,&local_5c8,
                               (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_,
                               LCT_GREY,(uint)(local_1ac == 0x10) * 8 + 8);
      uVar41 = local_5c4;
      uVar34 = local_5c8;
      if (uVar18 != 0) {
        local_408._0_8_ = lodepng_error_text(uVar18);
        ErrorExit<std::__cxx11::string_const&,char_const*>
                  ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5c0,(char **)local_408);
      }
      if (local_1ac == 0x10) {
        vStack_538.alloc.memoryResource._0_2_ = 0x59;
        local_540 = (undefined1  [8])0x1;
        auVar47._8_8_ = 0;
        auVar47._0_8_ =
             local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._0_16_ = auVar47 << 0x40;
        _local_548 = (optional<float>)((long)local_540 + 8);
        AVar29.memoryResource = pstd::pmr::new_delete_resource();
        resolution_05.super_Tuple2<pbrt::Point2,_int>.y = uVar34;
        resolution_05.super_Tuple2<pbrt::Point2,_int>.x = uVar41;
        channels.n = 1;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_548;
        Image((Image *)local_408,Half,resolution_05,channels,(ColorEncodingHandle *)&local_5b8,
              AVar29);
        stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_408._8_4_);
        local_4a8._0_8_ = local_408._0_8_;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_498,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_3f8);
        local_478.bits._2_6_ = alStack_3e8[2]._2_6_;
        local_478.bits._0_2_ = (undefined2)alStack_3e8[2];
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_470,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_3d0);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_3b0);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,
                   (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_390);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_390);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_3b0);
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_3d0);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_3f8);
        if (_local_548 != (optional<float>)((long)local_540 + 8)) {
          operator_delete((void *)_local_548,(long)vStack_538.alloc.memoryResource + 1);
        }
        VVar36 = local_2f8.min;
        local_590 = __return_storage_ptr__;
        if (local_5c8 != 0) {
          local_5c0 = (Vec2<int>)((ulong)local_568 & 0xffff000000000000);
          pGVar45 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
          lVar38 = 0;
          uVar44 = 0;
          do {
            local_550 = uVar44;
            if (local_5c4 != 0) {
              uVar44 = 0;
              do {
                uVar14 = swap_bytes(*(undefined2 *)VVar36);
                FVar49 = (float)uVar14 / 65535.0;
                if (0x1ffffffffffff < (ulong)local_568) {
                  if (local_5c0 == (Vec2<int>)0x2000000000000) {
                    FVar49 = sRGBColorEncoding::ToFloatLinear((sRGBColorEncoding *)pGVar45,FVar49);
                  }
                  else {
                    FVar49 = GammaColorEncoding::ToFloatLinear(pGVar45,FVar49);
                  }
                }
                SetChannel((Image *)local_4a8,(Point2i)(lVar38 + uVar44),0,FVar49);
                uVar44 = uVar44 + 1;
                VVar36 = (Vec2<int>)((long)VVar36 + 2);
              } while (uVar44 < local_5c4);
            }
            uVar44 = local_550 + 1;
            lVar38 = lVar38 + 0x100000000;
          } while (uVar44 < local_5c8);
        }
        __return_storage_ptr__ = local_590;
        if (VVar36 != local_2f8.max) {
          LogFatal<char_const(&)[21]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                     ,0x4bb,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
        }
      }
      else {
        vStack_538.alloc.memoryResource._0_2_ = 0x59;
        local_540 = (undefined1  [8])0x1;
        local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_568;
        _local_548 = (optional<float>)((long)local_540 + 8);
        AVar29.memoryResource = pstd::pmr::new_delete_resource();
        resolution_06.super_Tuple2<pbrt::Point2,_int>.y = local_5c8;
        resolution_06.super_Tuple2<pbrt::Point2,_int>.x = local_5c4;
        channels_03.n = 1;
        channels_03.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_548;
        Image((Image *)local_408,U256,resolution_06,channels_03,(ColorEncodingHandle *)&local_5b8,
              AVar29);
        stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_408._8_4_);
        local_4a8._0_8_ = local_408._0_8_;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_498,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_3f8);
        local_478.bits._2_6_ = alStack_3e8[2]._2_6_;
        local_478.bits._0_2_ = (undefined2)alStack_3e8[2];
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_470,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_3d0);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_3b0);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,
                   (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_390);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_390);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_3b0);
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_3d0);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_3f8);
        if (_local_548 != (optional<float>)((long)local_540 + 8)) {
          operator_delete((void *)_local_548,(long)vStack_538.alloc.memoryResource + 1);
        }
        VVar36 = local_2f8.min;
        VVar46 = local_2f8.max;
        pvVar32 = RawPointer((Image *)local_4a8,(Point2i)0x0);
        sVar28 = (long)VVar46 - (long)VVar36;
        if (sVar28 != 0) {
          memmove(pvVar32,(void *)VVar36,sVar28);
        }
      }
      Image(&__return_storage_ptr__->image,(Image *)local_4a8);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      VVar36 = local_2f8.min;
      uVar8 = local_2e8._M_allocated_capacity;
    }
    else {
      local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._0_16_ = local_470._8_16_;
      uVar18 = lodepng::decode(&local_5b8,&local_5c4,&local_5c8,
                               (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_,
                               (uint)(local_1b0 == LCT_RGBA) * 4 + LCT_RGB,
                               (uint)(local_1ac == 0x10) * 8 + 8);
      uVar41 = local_5c4;
      uVar34 = local_5c8;
      if (uVar18 != 0) {
        local_408._0_8_ = lodepng_error_text(uVar18);
        ErrorExit<std::__cxx11::string_const&,char_const*>
                  ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5c0,(char **)local_408);
      }
      local_338._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_338._M_impl.super__Rb_tree_header._M_header;
      local_408[4] = 0;
      bStack_3c0 = false;
      local_388[0xc] = 0;
      local_368 = false;
      local_35c = false;
      local_354 = false;
      local_34c = false;
      local_338._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_338._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_348 = RGBColorSpace::sRGB;
      local_340 = true;
      local_338._M_impl.super__Rb_tree_header._M_header._M_right =
           local_338._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_1ac == 0x10) {
        if (local_1b0 == LCT_RGBA) {
          local_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&local_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2b8[0] = local_2a8;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_298[0] = local_288;
          local_288[0]._0_2_ = 0x41;
          local_298[1] = (long *)0x1;
          local_598.x = 0;
          local_598.y = 0;
          local_590 = __return_storage_ptr__;
          AVar29.memoryResource = pstd::pmr::new_delete_resource();
          resolution_07.super_Tuple2<pbrt::Point2,_int>.y = uVar34;
          resolution_07.super_Tuple2<pbrt::Point2,_int>.x = uVar41;
          channels_02.n = 4;
          channels_02.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)&local_548.__align,Half,resolution_07,channels_02,
                (ColorEncodingHandle *)&local_598,AVar29);
          stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_540._0_4_);
          local_4a8._0_4_ = local_548;
          local_4a8[4] = fStack_544._0_1_;
          local_4a8._5_3_ = fStack_544._1_3_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_498,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_540 + 8));
          local_478.bits = local_518.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_470,&local_510);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                     &local_4f0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,&local_4d0
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_4d0);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_4f0);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_510);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_540 + 8));
          lVar38 = -0x80;
          plVar37 = local_288;
          do {
            if (plVar37 != (long *)plVar37[-2]) {
              operator_delete((long *)plVar37[-2],*plVar37 + 1);
            }
            plVar37 = plVar37 + -4;
            lVar38 = lVar38 + 0x20;
          } while (lVar38 != 0);
          VVar36 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_5c8 != 0) {
            uVar42 = (ulong)local_568 & 0xffff000000000000;
            pGVar45 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
            uVar44 = 0;
            do {
              local_308 = uVar44;
              if (local_5c4 != 0) {
                local_300 = uVar44 << 0x20;
                uVar44 = 0;
                do {
                  if (local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= (ulong)VVar36) {
                    LogFatal<char_const(&)[20]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                               ,0x4d6,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                  }
                  uVar14 = swap_bytes(*(undefined2 *)VVar36);
                  uVar15 = swap_bytes(*(undefined2 *)((long)VVar36 + 2));
                  fStack_544 = (float)uVar15 / 65535.0;
                  local_548 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                              ((float)uVar14 / 65535.0);
                  uVar14 = swap_bytes(*(undefined2 *)((long)VVar36 + 4));
                  uVar15 = swap_bytes(*(undefined2 *)((long)VVar36 + 6));
                  local_540._4_4_ = (float)uVar15 / 65535.0;
                  local_540._0_4_ = (float)uVar14 / 65535.0;
                  PVar35.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(uVar44 + local_300);
                  lVar38 = 0;
                  local_5c0 = VVar36;
                  local_550 = uVar44;
                  do {
                    FVar49 = *(Float *)(local_540 + lVar38 * 4 + -8);
                    if (0x1ffffffffffff < (ulong)local_568) {
                      if (uVar42 == 0x2000000000000) {
                        FVar49 = sRGBColorEncoding::ToFloatLinear
                                           ((sRGBColorEncoding *)pGVar45,FVar49);
                      }
                      else {
                        FVar49 = GammaColorEncoding::ToFloatLinear(pGVar45,FVar49);
                      }
                    }
                    *(Float *)(local_540 + lVar38 * 4 + -8) = FVar49;
                    SetChannel((Image *)local_4a8,PVar35,(int)lVar38,FVar49);
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 4);
                  uVar44 = local_550 + 1;
                  VVar36 = (Vec2<int>)((long)local_5c0 + 8);
                } while (uVar44 < local_5c4);
              }
              uVar44 = local_308 + 1;
            } while (uVar44 < local_5c8);
          }
          __return_storage_ptr__ = local_590;
          if (VVar36 != (Vec2<int>)
                        local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                       ,0x4e2,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
          }
        }
        else {
          local_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&local_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2b8[0] = local_2a8;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_598.x = 0;
          local_598.y = 0;
          local_590 = __return_storage_ptr__;
          AVar29.memoryResource = pstd::pmr::new_delete_resource();
          resolution_10.super_Tuple2<pbrt::Point2,_int>.y = uVar34;
          resolution_10.super_Tuple2<pbrt::Point2,_int>.x = uVar41;
          channels_08.n = 3;
          channels_08.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)&local_548.__align,Half,resolution_10,channels_08,
                (ColorEncodingHandle *)&local_598,AVar29);
          stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_540._0_4_);
          local_4a8._0_4_ = local_548;
          local_4a8[4] = fStack_544._0_1_;
          local_4a8._5_3_ = fStack_544._1_3_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_498,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_540 + 8));
          local_478.bits = local_518.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_470,&local_510);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                     &local_4f0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,&local_4d0
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_4d0);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_4f0);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_510);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_540 + 8));
          lVar38 = -0x60;
          plVar37 = local_2a8;
          do {
            if (plVar37 != (long *)plVar37[-2]) {
              operator_delete((long *)plVar37[-2],*plVar37 + 1);
            }
            plVar37 = plVar37 + -4;
            lVar38 = lVar38 + 0x20;
          } while (lVar38 != 0);
          VVar36 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_5c8 != 0) {
            uVar42 = (ulong)local_568 & 0xffff000000000000;
            pGVar45 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
            uVar44 = 0;
            do {
              local_308 = uVar44;
              if (local_5c4 != 0) {
                local_300 = uVar44 << 0x20;
                uVar44 = 0;
                do {
                  if (local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= (ulong)VVar36) {
                    LogFatal<char_const(&)[20]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                               ,0x4e8,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                  }
                  uVar14 = swap_bytes(*(undefined2 *)VVar36);
                  uVar15 = swap_bytes(*(undefined2 *)((long)VVar36 + 2));
                  fStack_544 = (float)uVar15 / 65535.0;
                  local_548 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                              ((float)uVar14 / 65535.0);
                  uVar14 = swap_bytes(*(undefined2 *)((long)VVar36 + 4));
                  local_540._0_4_ = (float)uVar14 / 65535.0;
                  PVar35.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(uVar44 + local_300);
                  lVar38 = 0;
                  local_5c0 = VVar36;
                  local_550 = uVar44;
                  do {
                    FVar49 = *(Float *)(local_540 + lVar38 * 4 + -8);
                    if (0x1ffffffffffff < (ulong)local_568) {
                      if (uVar42 == 0x2000000000000) {
                        FVar49 = sRGBColorEncoding::ToFloatLinear
                                           ((sRGBColorEncoding *)pGVar45,FVar49);
                      }
                      else {
                        FVar49 = GammaColorEncoding::ToFloatLinear(pGVar45,FVar49);
                      }
                    }
                    *(Float *)(local_540 + lVar38 * 4 + -8) = FVar49;
                    SetChannel((Image *)local_4a8,PVar35,(int)lVar38,FVar49);
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 3);
                  uVar44 = local_550 + 1;
                  VVar36 = (Vec2<int>)((long)local_5c0 + 6);
                } while (uVar44 < local_5c4);
              }
              uVar44 = local_308 + 1;
            } while (uVar44 < local_5c8);
          }
          __return_storage_ptr__ = local_590;
          if (VVar36 != (Vec2<int>)
                        local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                       ,0x4f3,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
          }
        }
      }
      else {
        if (local_1b0 == LCT_RGBA) {
          local_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&local_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2b8[0] = local_2a8;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_298[0] = local_288;
          local_288[0]._0_2_ = 0x41;
          local_298[1] = (long *)0x1;
          local_598 = local_568;
          AVar29.memoryResource = pstd::pmr::new_delete_resource();
          resolution_09.super_Tuple2<pbrt::Point2,_int>.y = local_5c8;
          resolution_09.super_Tuple2<pbrt::Point2,_int>.x = local_5c4;
          channels_07.n = 4;
          channels_07.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)&local_548.__align,U256,resolution_09,channels_07,
                (ColorEncodingHandle *)&local_598,AVar29);
          stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_540._0_4_);
          local_4a8._0_4_ = local_548;
          local_4a8[4] = fStack_544._0_1_;
          local_4a8._5_3_ = fStack_544._1_3_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_498,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_540 + 8));
          local_478.bits = local_518.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_470,&local_510);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                     &local_4f0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,&local_4d0
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_4d0);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_4f0);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_510);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_540 + 8));
          lVar38 = -0x80;
          plVar37 = local_288;
          do {
            if (plVar37 != (long *)plVar37[-2]) {
              operator_delete((long *)plVar37[-2],*plVar37 + 1);
            }
            plVar37 = plVar37 + -4;
            lVar38 = lVar38 + 0x20;
          } while (lVar38 != 0);
          VVar36 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          VVar46 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar32 = RawPointer((Image *)local_4a8,(Point2i)0x0);
        }
        else {
          local_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&local_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2b8[0] = local_2a8;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_598 = local_568;
          AVar29.memoryResource = pstd::pmr::new_delete_resource();
          resolution_11.super_Tuple2<pbrt::Point2,_int>.y = local_5c8;
          resolution_11.super_Tuple2<pbrt::Point2,_int>.x = local_5c4;
          channels_09.n = 3;
          channels_09.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)&local_548.__align,U256,resolution_11,channels_09,
                (ColorEncodingHandle *)&local_598,AVar29);
          stack0xfffffffffffffb60 = (V2f)CONCAT44(fStack_49c,local_540._0_4_);
          local_4a8._0_4_ = local_548;
          local_4a8[4] = fStack_544._0_1_;
          local_4a8._5_3_ = fStack_544._1_3_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_498,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_540 + 8));
          local_478.bits = local_518.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_470,&local_510);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450,
                     &local_4f0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430,&local_4d0
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_4d0);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_4f0);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_510);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_540 + 8));
          lVar38 = -0x60;
          plVar37 = local_2a8;
          do {
            if (plVar37 != (long *)plVar37[-2]) {
              operator_delete((long *)plVar37[-2],*plVar37 + 1);
            }
            plVar37 = plVar37 + -4;
            lVar38 = lVar38 + 0x20;
          } while (lVar38 != 0);
          VVar36 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          VVar46 = (Vec2<int>)
                   local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar32 = RawPointer((Image *)local_4a8,(Point2i)0x0);
        }
        if ((long)VVar46 - (long)VVar36 != 0) {
          memmove(pvVar32,(void *)VVar36,(long)VVar46 - (long)VVar36);
        }
      }
      Image(&__return_storage_ptr__->image,(Image *)local_4a8);
      ImageMetadata::ImageMetadata(&__return_storage_ptr__->metadata,(ImageMetadata *)local_408);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_338);
      if (local_340 == true) {
        local_340 = false;
      }
      if (local_34c == true) {
        local_34c = false;
      }
      if (local_354 == true) {
        local_354 = false;
      }
      if (local_35c == true) {
        local_35c = false;
      }
      if (local_368 == true) {
        local_368 = false;
      }
      if ((bool)local_388[0xc] == true) {
        local_388[0xc] = 0;
      }
      if (bStack_3c0 == true) {
        bStack_3c0 = false;
      }
      if ((bool)local_408[4] == true) {
        local_408[4] = 0;
      }
      VVar36 = (Vec2<int>)
               local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    }
    if (VVar36 != (Vec2<int>)0x0) {
      operator_delete((void *)VVar36,uVar8 - (long)VVar36);
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_430);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
              ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_450);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_470)
    ;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_498);
    if ((undefined1 *)CONCAT44(local_588._4_4_,local_588._0_4_) == local_588 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((undefined1 *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._16_8_ + 1);
    return __return_storage_ptr__;
  }
  local_278 = (undefined1  [8])oVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"pfm","");
  bVar12 = HasExtension((string *)local_5c0,(string *)local_278);
  if ((optional<float>)local_278 != oVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  VVar36 = local_5c0;
  if (bVar12) {
    _local_540 = ZEXT816(0);
    vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
    local_278[4] = 0;
    local_230 = local_230 & 0xffffff00;
    local_1ec = false;
    local_1d8 = false;
    local_1cc = false;
    local_1c4 = false;
    local_1bc = false;
    local_1b0 = local_1b0 & 0xffffff00;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    _local_548 = (optional<float>)alloc.memoryResource;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    __stream = fopen(*(char **)local_5c0,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar27 = "%s: unable to open PFM file";
    }
    else {
      local_590 = __return_storage_ptr__;
      iVar16 = readWord((FILE *)__stream,local_4a8,bufferLength);
      if (iVar16 == -1) {
        pcVar27 = "%s: unable to read PFM file";
      }
      else {
        bVar12 = local_4a8[2] == U256 >> 0x10 && (ushort)local_4a8._0_8_ == 0x6650;
        if (bVar12) {
          uVar34 = 1;
          uVar14 = 0;
        }
        else {
          uVar34 = 3;
          uVar14 = (ushort)(byte)local_4a8[2] | (ushort)local_4a8._0_8_ ^ 18000;
          if (uVar14 != 0) {
            ErrorExit<std::__cxx11::string_const&,char&,char&>
                      ("%s: unable to decode PFM file type \"%c%c\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)VVar36,
                       local_4a8,local_4a8 + 1);
          }
        }
        pfVar31 = (float *)(ulong)uVar14;
        iVar16 = readWord((FILE *)__stream,local_4a8,bufferLength_00);
        if (iVar16 != -1) {
          ppVar33 = (pbrt *)strlen(local_4a8);
          str._M_str = local_588;
          str._M_len = (size_t)local_4a8;
          bVar13 = Atoi(ppVar33,str,(int *)pfVar31);
          if (!bVar13) {
            pcVar27 = "%s: unable to decode width \"%s\"";
LAB_0021fd97:
            ErrorExit<std::__cxx11::string_const&,char(&)[80]>
                      (pcVar27,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5c0,(char (*) [80])local_4a8);
          }
          iVar16 = readWord((FILE *)__stream,local_4a8,bufferLength_01);
          if (iVar16 != -1) {
            ppVar33 = (pbrt *)strlen(local_4a8);
            str_00._M_str = (char *)&local_5b8;
            str_00._M_len = (size_t)local_4a8;
            bVar13 = Atoi(ppVar33,str_00,(int *)pfVar31);
            if (!bVar13) {
              pcVar27 = "%s: unable to decode height \"%s\"";
              goto LAB_0021fd97;
            }
            iVar16 = readWord((FILE *)__stream,local_4a8,bufferLength_02);
            if (iVar16 != -1) {
              ppVar33 = (pbrt *)strlen(local_4a8);
              str_01._M_str = (char *)&local_598;
              str_01._M_len = (size_t)local_4a8;
              bVar13 = Atof(ppVar33,str_01,pfVar31);
              if (!bVar13) {
                pcVar27 = "%s: unable to decode scale \"%s\"";
                goto LAB_0021fd97;
              }
              uVar41 = local_588._0_4_ * uVar34 *
                       (int)local_5b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              uVar44 = (ulong)uVar41;
              pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                         &local_548.__align,uVar44);
              iVar16 = (int)local_5b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              do {
                VVar36 = local_5c0;
                if (iVar16 < 1) {
                  if ((uVar44 != 0) && (0.0 <= (float)local_598.x)) {
                    uVar42 = 0;
                    do {
                      uVar3 = swap_bytes(*(undefined4 *)((long)local_540 + uVar42 * 4));
                      *(undefined4 *)((long)local_540 + uVar42 * 4) = uVar3;
                      uVar42 = uVar42 + 1;
                    } while (uVar44 != uVar42);
                  }
                  if (uVar41 != 0) {
                    auVar5._8_4_ = 0x7fffffff;
                    auVar5._0_8_ = 0x7fffffff7fffffff;
                    auVar5._12_4_ = 0x7fffffff;
                    auVar47 = vandps_avx512vl(ZEXT416((uint)local_598.x),auVar5);
                    if ((auVar47._0_4_ != 1.0) || (NAN(auVar47._0_4_))) {
                      uVar42 = 0;
                      auVar50._8_4_ = 0x7fffffff;
                      auVar50._0_8_ = 0x7fffffff7fffffff;
                      auVar50._12_4_ = 0x7fffffff;
                      do {
                        auVar47 = vandps_avx(ZEXT416((uint)local_598.x),auVar50);
                        *(float *)((long)local_540 + uVar42 * 4) =
                             auVar47._0_4_ * *(float *)((long)local_540 + uVar42 * 4);
                        uVar42 = uVar42 + 1;
                      } while (uVar44 != uVar42);
                    }
                  }
                  fclose(__stream);
                  if (LOGGING_LogLevel < 1) {
                    local_408._8_8_ = (float *)0x0;
                    auStack_3f8._0_8_ = auStack_3f8._0_8_ & 0xffffffffffffff00;
                    local_408._0_8_ = auStack_3f8;
                    detail::stringPrintfRecursive<std::__cxx11::string_const&,int&,int&>
                              ((string *)local_408,"Read PFM image %s (%d x %d)",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               VVar36,(int *)local_588,(int *)&local_5b8);
                    Log(Verbose,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                        ,0x5e1,(char *)local_408._0_8_);
                    if ((undefined1 *)local_408._0_8_ != auStack_3f8) {
                      operator_delete((void *)local_408._0_8_,(ulong)(auStack_3f8._0_8_ + 1));
                    }
                  }
                  __return_storage_ptr__ = local_590;
                  if ((bool)(undefined1)local_1b0 == true) {
                    local_1b0 = local_1b0 & 0xffffff00;
                  }
                  local_1b8 = RGBColorSpace::sRGB;
                  local_1b0 = CONCAT31(local_1b0._1_3_,1);
                  if (bVar12) {
                    pvVar39 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_408;
                    local_408._0_4_ = local_548;
                    local_408[4] = fStack_544._0_1_;
                    local_408._5_3_ = fStack_544._1_3_;
                    auStack_3f8._0_8_ = vStack_538.alloc.memoryResource;
                    auStack_3f8._8_8_ = vStack_538.ptr;
                    local_408._8_8_ = local_540;
                    vStack_538.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    _local_540 = ZEXT816(0);
                    local_2e8._M_allocated_capacity._0_2_ = 0x59;
                    local_2f8.max.x = 1;
                    local_2f8.max.y = 0;
                    local_2f8.min = (Vec2<int>)&local_2e8;
                    resolution_01.super_Tuple2<pbrt::Point2,_int>.y =
                         (int)local_5b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    resolution_01.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
                    channels_06.n = 1;
                    channels_06.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2f8;
                    Image(&local_590->image,pvVar39,resolution_01,channels_06);
                    ImageMetadata::ImageMetadata
                              (&__return_storage_ptr__->metadata,(ImageMetadata *)local_278);
                    if (local_2f8.min != (Vec2<int>)&local_2e8) {
                      operator_delete((void *)local_2f8.min,local_2e8._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    pvVar39 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8;
                    local_2e8._M_allocated_capacity = (size_type)vStack_538.alloc.memoryResource;
                    local_2e8._8_8_ = vStack_538.ptr;
                    local_2f8.max.x = local_540._0_4_;
                    local_2f8.max.y = local_540._4_4_;
                    local_2f8.min = (Vec2<int>)_local_548;
                    vStack_538.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    _local_540 = ZEXT816(0);
                    local_408._0_8_ = auStack_3f8;
                    auStack_3f8._0_2_ = 0x52;
                    local_408._8_4_ = 1.4013e-45;
                    local_408._12_4_ = 0.0;
                    alStack_3e8[0] = (long)(alStack_3e8 + 2);
                    alStack_3e8[2]._0_2_ = 0x47;
                    alStack_3e8[1] = 1;
                    lStack_3c8 = (long)&lStack_3b8;
                    lStack_3b8 = CONCAT62(lStack_3b8._2_6_,0x42);
                    bStack_3c0 = true;
                    uStack_3bf = 0;
                    resolution_00.super_Tuple2<pbrt::Point2,_int>.y =
                         (int)local_5b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    resolution_00.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
                    channels_05.n = 3;
                    channels_05.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_408;
                    Image(&local_590->image,pvVar39,resolution_00,channels_05);
                    ImageMetadata::ImageMetadata
                              (&__return_storage_ptr__->metadata,(ImageMetadata *)local_278);
                    lVar38 = -0x60;
                    plVar37 = &lStack_3b8;
                    do {
                      if (plVar37 != (long *)plVar37[-2]) {
                        operator_delete((long *)plVar37[-2],*plVar37 + 1);
                      }
                      plVar37 = plVar37 + -4;
                      lVar38 = lVar38 + 0x20;
                    } while (lVar38 != 0);
                  }
                  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(pvVar39);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::~_Rb_tree(local_1a8);
                  if ((bool)(undefined1)local_1b0 == true) {
                    local_1b0 = local_1b0 & 0xffffff00;
                  }
                  if (local_1bc == true) {
                    local_1bc = false;
                  }
                  if (local_1c4 == true) {
                    local_1c4 = false;
                  }
                  if (local_1cc == true) {
                    local_1cc = false;
                  }
                  if (local_1d8 == true) {
                    local_1d8 = false;
                  }
                  if (local_1ec == true) {
                    local_1ec = false;
                  }
                  if (local_230._0_1_ == true) {
                    local_230 = local_230 & 0xffffff00;
                  }
                  if ((bool)local_278[4] == true) {
                    local_278[4] = 0;
                  }
                  goto LAB_0021fa45;
                }
                iVar16 = iVar16 + -1;
                sVar28 = fread((void *)((long)local_540 +
                                       (long)(int)(local_588._0_4_ * uVar34 * iVar16) * 4),4,
                               (long)(int)(local_588._0_4_ * uVar34),__stream);
              } while (sVar28 == (long)(int)local_588._0_4_ * (ulong)uVar34);
            }
          }
        }
        fclose(__stream);
        pcVar27 = "%s: premature end of file in PFM file";
      }
    }
    ErrorExit<std::__cxx11::string_const&>
              (pcVar27,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5c0);
  }
  local_278 = (undefined1  [8])oVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"hdr","");
  bVar12 = HasExtension((string *)local_5c0,(string *)local_278);
  if ((optional<float>)local_278 != oVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (!bVar12) {
    first = stbi_load(*(char **)local_5c0,(int *)&local_2f8,(int *)local_588,(int *)&local_5b8,0);
    if (first == (stbi_uc *)0x0) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: no support for reading images with this extension",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
    }
    local_278 = (undefined1  [8])alloc.memoryResource;
    pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>::
    vector<unsigned_char*>
              ((vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>> *)
               &local_548.__align,first,
               first + (long)(int)local_5b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start *
                       (long)(int)local_588._0_4_ * (long)local_2f8.min.x,
               (polymorphic_allocator<unsigned_char> *)local_278);
    stbi_image_free(first);
    switch((int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
    case 1:
      local_70.alloc.memoryResource = (memory_resource *)_local_548;
      _local_540 = ZEXT812(0);
      register0x0000120c = 0;
      local_70.nStored = (size_t)vStack_538.ptr;
      vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_278 = (undefined1  [8])oVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Y","");
      local_38 = ColorEncodingHandle::sRGB;
      resolution_08.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_08.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      channels_04.n = 1;
      channels_04.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      Image(&__return_storage_ptr__->image,&local_70,resolution_08,channels_04,
            (ColorEncodingHandle *)&local_38);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      if ((optional<float>)local_278 != oVar2) {
        operator_delete((void *)local_278,auStack_268._0_8_ + 1);
      }
      this_00 = &local_70;
      break;
    case 2:
      local_90.alloc.memoryResource = (memory_resource *)_local_548;
      _local_540 = ZEXT812(0);
      register0x0000120c = 0;
      local_90.nStored = (size_t)vStack_538.ptr;
      vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_408._0_8_ = auStack_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Y","");
      plVar37 = alStack_3e8 + 2;
      alStack_3e8[0] = (long)plVar37;
      std::__cxx11::string::_M_construct<char_const*>((string *)alStack_3e8,"A","");
      local_40 = ColorEncodingHandle::sRGB;
      resolution_14.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_14.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      channels_15.n = 2;
      channels_15.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
      Image((Image *)local_278,&local_90,resolution_14,channels_15,(ColorEncodingHandle *)&local_40)
      ;
      lVar38 = -0x40;
      do {
        if (plVar37 != (long *)plVar37[-2]) {
          operator_delete((long *)plVar37[-2],*plVar37 + 1);
        }
        plVar37 = plVar37 + -4;
        lVar38 = lVar38 + 0x20;
      } while (lVar38 != 0);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_90);
      local_4a8._0_8_ = auStack_498;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Y","");
      requestedChannels_02.n = 1;
      requestedChannels_02.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
      GetChannelDesc((ImageChannelDesc *)local_408,(Image *)local_278,requestedChannels_02);
      AVar29.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_408
                     ,AVar29);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_408);
      if ((undefined1 *)local_4a8._0_8_ != auStack_498) {
        operator_delete((void *)local_4a8._0_8_,(long)auStack_498 + 1);
      }
      goto LAB_0021fc68;
    case 3:
      local_b0.alloc.memoryResource = (memory_resource *)_local_548;
      _local_540 = ZEXT812(0);
      register0x0000120c = 0;
      local_b0.nStored = (size_t)vStack_538.ptr;
      vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_278 = (undefined1  [8])oVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"R","");
      auStack_268._16_8_ = auStack_268 + 0x20;
      std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_268 + 0x10),"G","");
      plVar37 = (long *)(auStack_22c + 4);
      plStack_238 = plVar37;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_238,"B","");
      local_48 = ColorEncodingHandle::sRGB;
      resolution_12.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_12.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      channels_11.n = 3;
      channels_11.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      Image(&__return_storage_ptr__->image,&local_b0,resolution_12,channels_11,
            (ColorEncodingHandle *)&local_48);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      lVar38 = -0x60;
      do {
        if (plVar37 != (long *)plVar37[-2]) {
          operator_delete((long *)plVar37[-2],*plVar37 + 1);
        }
        plVar37 = plVar37 + -4;
        lVar38 = lVar38 + 0x20;
      } while (lVar38 != 0);
      this_00 = &local_b0;
      break;
    case 4:
      local_d0.alloc.memoryResource = (memory_resource *)_local_548;
      _local_540 = ZEXT812(0);
      register0x0000120c = 0;
      local_d0.nStored = (size_t)vStack_538.ptr;
      vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_408._0_8_ = auStack_3f8;
      local_590 = __return_storage_ptr__;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"R","");
      alStack_3e8[0] = (long)(alStack_3e8 + 2);
      std::__cxx11::string::_M_construct<char_const*>((string *)alStack_3e8,"G","");
      plVar37 = &lStack_3b8;
      lStack_3c8 = (long)plVar37;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lStack_3c8,"B","");
      plVar43 = &lStack_398;
      local_3a8[0] = plVar43;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"A","");
      local_50 = ColorEncodingHandle::sRGB;
      resolution_13.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_13.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      channels_13.n = 4;
      channels_13.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
      Image((Image *)local_278,&local_d0,resolution_13,channels_13,(ColorEncodingHandle *)&local_50)
      ;
      lVar38 = -0x80;
      do {
        if (plVar43 != (long *)plVar43[-2]) {
          operator_delete((long *)plVar43[-2],*plVar43 + 1);
        }
        plVar43 = plVar43 + -4;
        lVar38 = lVar38 + 0x20;
      } while (lVar38 != 0);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_d0);
      local_408._0_8_ = auStack_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"R","");
      alStack_3e8[0] = (long)(alStack_3e8 + 2);
      std::__cxx11::string::_M_construct<char_const*>((string *)alStack_3e8,"G","");
      lStack_3c8 = (long)plVar37;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lStack_3c8,"B","");
      __return_storage_ptr__ = local_590;
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
      GetChannelDesc((ImageChannelDesc *)local_4a8,(Image *)local_278,requestedChannels_00);
      AVar29.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_4a8
                     ,AVar29);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_4a8);
      lVar38 = -0x60;
      do {
        if (plVar37 != (long *)plVar37[-2]) {
          operator_delete((long *)plVar37[-2],*plVar37 + 1);
        }
        plVar37 = plVar37 + -4;
        lVar38 = lVar38 + 0x20;
      } while (lVar38 != 0);
LAB_0021fc68:
      ~Image((Image *)local_278);
      goto LAB_0021fc75;
    default:
      ErrorExit<std::__cxx11::string_const&,int&>
                ("%s: %d channel image unsupported.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                 (int *)&local_5b8);
    }
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(this_00);
LAB_0021fc75:
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
               &local_548.__align);
    return __return_storage_ptr__;
  }
  pfVar31 = stbi_loadf(*(char **)local_5c0,(int *)local_588,(int *)&local_5b8,&local_598.x,0);
  if (pfVar31 == (float *)0x0) {
    local_278 = (undefined1  [8])stbi_failure_reason();
    ErrorExit<std::__cxx11::string_const&,char_const*>
              ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5c0,(char **)local_278);
  }
  local_278 = (undefined1  [8])alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)&local_548.__align,pfVar31,
             pfVar31 + (long)local_598.x *
                       (long)(int)local_5b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start *
                       (long)(int)local_588._0_4_,(polymorphic_allocator<float> *)local_278);
  stbi_image_free(pfVar31);
  aVar10 = _local_270;
  switch(local_598.x) {
  case 1:
    local_278._0_4_ = local_548;
    local_278[4] = fStack_544._0_1_;
    local_278._5_3_ = fStack_544._1_3_;
    auStack_268._8_8_ = vStack_538.ptr;
    auStack_268._0_8_ = vStack_538.alloc.memoryResource;
    local_270 = local_540;
    _local_540 = ZEXT816(0);
    vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_3f8._0_2_ = 0x59;
    local_408._8_4_ = 1.4013e-45;
    local_408._12_4_ = 0.0;
    resolution.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    channels_00.n = 1;
    channels_00.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
    ;
    local_408._0_8_ = auStack_3f8;
    Image(&__return_storage_ptr__->image,
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_278,resolution,
          channels_00);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    if ((undefined1 *)local_408._0_8_ != auStack_3f8) {
      operator_delete((void *)local_408._0_8_,auStack_3f8._0_8_ + 1);
    }
    pvVar39 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_278;
    break;
  case 2:
    local_4a8._0_4_ = local_548;
    local_4a8[4] = fStack_544._0_1_;
    local_4a8._5_3_ = fStack_544._1_3_;
    auStack_498 = (undefined1  [8])vStack_538.alloc.memoryResource;
    _fStack_490 = vStack_538.ptr;
    local_4a8._8_4_ = local_540._0_4_;
    fStack_49c = (float)local_540._4_4_;
    _local_540 = ZEXT816(0);
    vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_408._0_8_ = auStack_3f8;
    auStack_3f8._0_2_ = 0x59;
    local_408._8_4_ = 1.4013e-45;
    local_408._12_4_ = 0.0;
    plVar37 = alStack_3e8 + 2;
    alStack_3e8[2]._0_2_ = 0x41;
    alStack_3e8[1] = 1;
    resolution_04.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_04.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    channels_14.n = 2;
    channels_14.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
    ;
    alStack_3e8[0] = (long)plVar37;
    Image((Image *)local_278,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4a8,
          resolution_04,channels_14);
    lVar38 = -0x40;
    do {
      if (plVar37 != (long *)plVar37[-2]) {
        operator_delete((long *)plVar37[-2],*plVar37 + 1);
      }
      plVar37 = plVar37 + -4;
      lVar38 = lVar38 + 0x20;
    } while (lVar38 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4a8);
    local_2e8._M_allocated_capacity._0_2_ = 0x59;
    local_2f8.max.x = 1;
    local_2f8.max.y = 0;
    local_2f8.min = (Vec2<int>)&local_2e8;
    requestedChannels_01.n = 1;
    requestedChannels_01.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
    GetChannelDesc((ImageChannelDesc *)local_408,(Image *)local_278,requestedChannels_01);
    AVar29.memoryResource = pstd::pmr::new_delete_resource();
    SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_408,
                   AVar29);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_408);
    if (local_2f8.min != (Vec2<int>)&local_2e8) {
      operator_delete((void *)local_2f8.min,local_2e8._M_allocated_capacity + 1);
    }
    goto LAB_0021fa11;
  case 3:
    local_408._0_4_ = local_548;
    local_408[4] = fStack_544._0_1_;
    local_408._5_3_ = fStack_544._1_3_;
    auStack_3f8._0_8_ = vStack_538.alloc.memoryResource;
    auStack_3f8._8_8_ = vStack_538.ptr;
    local_408._8_8_ = local_540;
    _local_540 = ZEXT816(0);
    vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_268._0_2_ = 0x52;
    local_270 = (undefined1  [8])0x1;
    aVar11 = _local_270;
    _uStack_250 = aVar10._32_32_;
    _local_270 = aVar11._0_24_;
    auStack_268._16_8_ = auStack_268 + 0x20;
    auVar4 = _local_270;
    aVar11 = _local_270;
    stack0xfffffffffffffdba = aVar10._42_22_;
    _local_270 = aVar11._0_40_;
    auStack_248[0] = 0x47;
    uStack_250 = 1;
    _local_270 = CONCAT832(uStack_250,auVar4);
    plVar37 = (long *)(auStack_22c + 4);
    plStack_238 = plVar37;
    auStack_22c._4_2_ = 0x42;
    local_230 = 1;
    auStack_22c._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
    resolution_02.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_02.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    channels_10.n = 3;
    channels_10.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
    ;
    local_278 = (undefined1  [8])oVar2;
    Image(&__return_storage_ptr__->image,
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_408,resolution_02,
          channels_10);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    lVar38 = -0x60;
    do {
      if (plVar37 != (long *)plVar37[-2]) {
        operator_delete((long *)plVar37[-2],*plVar37 + 1);
      }
      plVar37 = plVar37 + -4;
      lVar38 = lVar38 + 0x20;
    } while (lVar38 != 0);
    pvVar39 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_408;
    break;
  case 4:
    local_2e8._M_allocated_capacity = (size_type)vStack_538.alloc.memoryResource;
    local_2e8._8_8_ = vStack_538.ptr;
    local_2f8.max.x = local_540._0_4_;
    local_2f8.max.y = local_540._4_4_;
    local_2f8.min = (Vec2<int>)_local_548;
    _local_540 = ZEXT816(0);
    vStack_538.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_3f8._0_2_ = 0x52;
    local_408._8_8_ = (float *)0x1;
    alStack_3e8[2]._0_2_ = 0x47;
    alStack_3e8[1] = 1;
    lStack_3b8 = CONCAT62(lStack_3b8._2_6_,0x42);
    bStack_3c0 = true;
    uStack_3bf = 0;
    plVar37 = &lStack_398;
    lStack_398 = CONCAT62(lStack_398._2_6_,0x41);
    local_3a8[1] = (long *)0x1;
    local_3a8[0] = plVar37;
    resolution_03.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_03.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    channels_12.n = 4;
    channels_12.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
    ;
    local_408._0_8_ = auStack_3f8;
    alStack_3e8[0] = (long)(alStack_3e8 + 2);
    lStack_3c8 = (long)&lStack_3b8;
    Image((Image *)local_278,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8,
          resolution_03,channels_12);
    lVar38 = -0x80;
    do {
      if (plVar37 != (long *)plVar37[-2]) {
        operator_delete((long *)plVar37[-2],*plVar37 + 1);
      }
      plVar37 = plVar37 + -4;
      lVar38 = lVar38 + 0x20;
    } while (lVar38 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8);
    auStack_3f8._0_2_ = 0x52;
    local_408._8_4_ = 1.4013e-45;
    local_408._12_4_ = 0.0;
    alStack_3e8[2]._0_2_ = 0x47;
    alStack_3e8[1] = 1;
    lStack_3b8 = CONCAT62(lStack_3b8._2_6_,0x42);
    bStack_3c0 = true;
    uStack_3bf = 0;
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
    local_408._0_8_ = auStack_3f8;
    alStack_3e8[0] = (long)(alStack_3e8 + 2);
    lStack_3c8 = (long)&lStack_3b8;
    GetChannelDesc((ImageChannelDesc *)local_4a8,(Image *)local_278,requestedChannels);
    AVar29.memoryResource = pstd::pmr::new_delete_resource();
    SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_4a8,
                   AVar29);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)0x0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_4a8);
    lVar38 = -0x60;
    plVar37 = &lStack_3b8;
    do {
      if (plVar37 != (long *)plVar37[-2]) {
        operator_delete((long *)plVar37[-2],*plVar37 + 1);
      }
      plVar37 = plVar37 + -4;
      lVar38 = lVar38 + 0x20;
    } while (lVar38 != 0);
LAB_0021fa11:
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_200);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
              ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
               (auStack_22c + 0xc));
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
               (auStack_268 + 0x28));
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8));
    goto LAB_0021fa45;
  default:
    ErrorExit<std::__cxx11::string_const&,int&>
              ("%s: %d channel image unsupported.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
               &local_598.x);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(pvVar39);
LAB_0021fa45:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_548.__align);
  return __return_storage_ptr__;
}

Assistant:

ImageAndMetadata Image::Read(const std::string &name, Allocator alloc,
                             ColorEncodingHandle encoding) {
    if (HasExtension(name, "exr"))
        return ReadEXR(name, alloc);
    else if (HasExtension(name, "png"))
        return ReadPNG(name, alloc, encoding);
    else if (HasExtension(name, "pfm"))
        return ReadPFM(name, alloc);
    else if (HasExtension(name, "hdr"))
        return ReadHDR(name, alloc);
    else {
        int x, y, n;
        unsigned char *data = stbi_load(name.c_str(), &x, &y, &n, 0);
        if (data) {
            pstd::vector<uint8_t> pixels(data, data + x * y * n, alloc);
            stbi_image_free(data);
            switch (n) {
            case 1:
                return ImageAndMetadata{
                    Image(std::move(pixels), {x, y}, {"Y"}, ColorEncodingHandle::sRGB),
                    ImageMetadata()};
            case 2: {
                Image image(std::move(pixels), {x, y}, {"Y", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{image.SelectChannels(image.GetChannelDesc({"Y"})),
                                        ImageMetadata()};
            }
            case 3:
                return ImageAndMetadata{Image(std::move(pixels), {x, y}, {"R", "G", "B"},
                                              ColorEncodingHandle::sRGB),
                                        ImageMetadata()};
            case 4: {
                Image image(std::move(pixels), {x, y}, {"R", "G", "B", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{
                    image.SelectChannels(image.GetChannelDesc({"R", "G", "B"})),
                    ImageMetadata()};
            }
            default:
                ErrorExit("%s: %d channel image unsupported.", name, n);
            }
        } else
            ErrorExit("%s: no support for reading images with this extension", name);
    }
}